

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
::ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
                  *this,Target *target,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  AY38910<false> *this_01;
  TapePlayer *this_02;
  VIAPortHandler *this_03;
  byte *pbVar1;
  DiskInterface DVar2;
  Name name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  BinaryTapePlayer *this_04;
  bool bVar4;
  long lVar5;
  iterator iVar6;
  undefined4 *puVar7;
  byte bVar8;
  long lVar9;
  Microdisc *pMVar10;
  Name basic;
  Speaker *local_108;
  Microdisc *local_100;
  Microdisc *local_f8;
  JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1> *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  BinaryTapePlayer *local_e0;
  AsyncTaskQueue<false,_true,_void> *local_d8;
  long local_d0;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  undefined1 local_80 [40];
  Request request;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_0057cd70;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00589370;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00589468;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005894a0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_005894b8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005894d0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005894e8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00589518;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00589558;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00589578;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00589590;
  (this->super_Delegate).super_Delegate._vptr_Delegate = (_func_int **)&DAT_005895a8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005895c8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005895e0;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_00589600;
  this->basic_invisible_ram_top_ = 0xffff;
  this->basic_visible_ram_top_ = 0xbfff;
  CPU::MOS6502::
  Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>,_false>
  ::Processor(&(this->m6502_).
               super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>,_false>
              ,this);
  local_e8 = &this->rom_;
  local_f0 = &this->video_;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->tape_get_byte_address_ = 0;
  this->tape_speed_address_ = 0;
  this->keyboard_read_count_ = 0;
  JustInTimeActor<Oric::VideoOutput,Cycles,1,1>::JustInTimeActor<unsigned_char(&)[65536]>
            ((JustInTimeActor<Oric::VideoOutput,Cycles,1,1> *)local_f0,&this->ram_);
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_d0 = 0x108;
  this_01 = &this->ay8910_;
  local_d8 = this_00;
  GI::AY38910::AY38910<false>::AY38910SampleSource(this_01,AY38910,this_00);
  local_108 = &this->speaker_;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass(local_108,this_01);
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00587d90;
  this_02 = &this->tape_player_;
  TapePlayer::TapePlayer(this_02);
  this->use_fast_tape_hack_ = false;
  this_03 = &this->via_port_handler_;
  local_e0 = &this_02->super_BinaryTapePlayer;
  VIAPortHandler::VIAPortHandler(this_03,local_d8,this_01,local_108,this_02,&this->keyboard_);
  MOS::MOS6522::MOS6522<Oric::VIAPortHandler>::MOS6522(&this->via_,this_03);
  (this->keyboard_).row_ = '\0';
  (this->keyboard_).special_key_handler_ = &this->super_SpecialKeyHandler;
  (this->keyboard_).rows_[0] = '\0';
  (this->keyboard_).rows_[1] = '\0';
  (this->keyboard_).rows_[2] = '\0';
  (this->keyboard_).rows_[3] = '\0';
  (this->keyboard_).rows_[4] = '\0';
  (this->keyboard_).rows_[5] = '\0';
  (this->keyboard_).rows_[6] = '\0';
  (this->keyboard_).rows_[7] = '\0';
  local_f8 = &this->microdisc_;
  Microdisc::Microdisc(local_f8);
  local_100 = (Microdisc *)&this->jasmin_;
  Jasmin::Jasmin((Jasmin *)local_100);
  this_04 = local_e0;
  this->jasmin_reset_counter_ = 0;
  BD500::BD500(&this->bd500_);
  roms._M_t._M_impl._0_4_ = 2000000;
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::JustInTimeActor<int>(&this->diskii_,(int *)&roms);
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pravetz_rom_base_pointer_ = 0;
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->ram_top_ = this->basic_visible_ram_top_;
  this->paged_rom_ = (uint8_t *)0x0;
  (this->string_serialiser_)._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  (this->super_TimedMachine).clock_rate_ = 1000000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&local_108->
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1e+06);
  MOS::MOS6522::IRQDelegatePortHandler::set_interrupt_delegate
            (&this_03->super_IRQDelegatePortHandler,&this->super_Delegate);
  Storage::Tape::BinaryTapePlayer::set_delegate(this_04,&this->super_Delegate);
  Memory::Fuzz(this->ram_,0x10000);
  local_d0 = (long)&(this->super_TimedMachine)._vptr_TimedMachine + local_d0;
  for (lVar5 = 0xe10; lVar5 != 0x10e10; lVar5 = lVar5 + 1) {
    pbVar1 = (byte *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar5);
    *pbVar1 = *pbVar1 | 0x40;
  }
  ROM::Request::Request(&request,OricColourROM,true);
  if (target->rom == BASIC10) {
    basic = OricBASIC10;
    name = OricBASIC10;
  }
  else if (target->rom == Pravetz) {
    basic = OricPravetzBASIC;
    name = OricPravetzBASIC;
  }
  else {
    basic = OricBASIC11;
    name = OricBASIC11;
  }
  ROM::Request::Request((Request *)local_80,name,false);
  ROM::Request::operator&&((Request *)&roms,&request,(Request *)local_80);
  ROM::Request::Node::operator=(&request.node,(Node *)&roms);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)(local_80 + 0x10));
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,(Request *)&request.node);
  bVar4 = ROM::Request::validate(&request,&roms);
  if (!bVar4) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&ROMMachine::Error::typeinfo,0);
  }
  local_80._0_4_ = 0x48;
  iVar6 = std::
          _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&roms._M_t,(key_type *)local_80);
  if ((_Rb_tree_header *)iVar6._M_node != &roms._M_t._M_impl.super__Rb_tree_header) {
    JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::operator->
              ((JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1> *)local_80);
    VideoOutput::set_colour_rom
              ((VideoOutput *)local_80._8_8_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar6._M_node[1]._M_parent)
    ;
  }
  iVar6 = std::
          _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&roms._M_t,&basic);
  pvVar3 = local_e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (local_e8,&iVar6._M_node[1]._M_parent);
  this->paged_rom_ =
       (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  DVar2 = target->disk_interface;
  if (DVar2 == Microdisc) {
    lVar5 = 0x128a8;
    lVar9 = 0x128b0;
    pMVar10 = local_f8;
  }
  else if (DVar2 == Jasmin) {
    lVar5 = 0x12da8;
    lVar9 = 0x12db0;
    pMVar10 = local_100;
  }
  else {
    if (DVar2 != BD500) goto LAB_003321db;
    lVar5 = 0x132a8;
    lVar9 = 0x132b0;
    pMVar10 = (Microdisc *)&this->bd500_;
  }
  *(long *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar9) = local_d0;
  *(long *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar5) = local_d0;
  (*(this->super_Delegate).super_Delegate._vptr_Delegate[1])(local_d0,pMVar10);
LAB_003321db:
  if ((target->loading_command)._M_string_length != 0) {
    type_string(this,&target->loading_command);
  }
  if (target->should_start_jasmin == true) {
    this->jasmin_reset_counter_ = 3000000;
  }
  if (target->rom < (Pravetz|BASIC11)) {
    bVar8 = (byte)(target->rom << 4);
    this->tape_get_byte_address_ = (uint16_t)(0xe6c9e6c9e630 >> (bVar8 & 0x3f));
    this->tape_speed_address_ = (uint16_t)(0x24d024d0067 >> (bVar8 & 0x3f));
  }
  insert_media(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&roms._M_t);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Oric::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
				m6502_(*this),
				video_(ram_),
				ay8910_(GI::AY38910::Personality::AY38910, audio_queue_),
				speaker_(ay8910_),
				via_port_handler_(audio_queue_, ay8910_, speaker_, tape_player_, keyboard_),
				via_(via_port_handler_),
				keyboard_(this),
				diskii_(2000000) {
			set_clock_rate(1000000);
			speaker_.set_input_rate(1000000.0f);
			via_port_handler_.set_interrupt_delegate(this);
			tape_player_.set_delegate(this);

			// Slight hack here: I'm unclear what RAM should look like at startup.
			// Actually, I think completely random might be right since the Microdisc
			// sort of assumes it, but also the BD-500 never explicitly sets PAL mode
			// so I can't have any switch-to-NTSC bytes in the display area. Hence:
			// disallow all atributes.
			Memory::Fuzz(ram_, sizeof(ram_));
			for(size_t c = 0; c < sizeof(ram_); ++c) {
				ram_[c] |= 0x40;
			}

			::ROM::Request request = ::ROM::Request(::ROM::Name::OricColourROM, true);
			::ROM::Name basic;
			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:	basic = ::ROM::Name::OricBASIC10;		break;
				default:
				case Analyser::Static::Oric::Target::ROM::BASIC11:	basic = ::ROM::Name::OricBASIC11;		break;
				case Analyser::Static::Oric::Target::ROM::Pravetz:	basic = ::ROM::Name::OricPravetzBASIC;	break;
			}
			request = request && ::ROM::Request(basic);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					request = request && ::ROM::Request(::ROM::Name::OricByteDrive500);
				break;
				case DiskInterface::Jasmin:
					request = request && ::ROM::Request(::ROM::Name::OricJasmin);
				break;
				case DiskInterface::Microdisc:
					request = request && ::ROM::Request(::ROM::Name::OricMicrodisc);
				break;
				case DiskInterface::Pravetz:
					request = request && ::ROM::Request(::ROM::Name::Oric8DOSBoot) && ::ROM::Request(::ROM::Name::DiskIIStateMachine16Sector);
				break;
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// The colour ROM is optional; an alternative composite encoding can be used if
			// it is absent.
			const auto colour_rom = roms.find(::ROM::Name::OricColourROM);
			if(colour_rom != roms.end()) {
				video_->set_colour_rom(colour_rom->second);
			}
			rom_ = std::move(roms.find(basic)->second);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricByteDrive500)->second);
				break;
				case DiskInterface::Jasmin:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricJasmin)->second);
				break;
				case DiskInterface::Microdisc:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricMicrodisc)->second);
				break;
				case DiskInterface::Pravetz: {
					pravetz_rom_ = std::move(roms.find(::ROM::Name::Oric8DOSBoot)->second);
					pravetz_rom_.resize(512);

					diskii_->set_state_machine(roms.find(::ROM::Name::DiskIIStateMachine16Sector)->second);
				} break;
			}

			paged_rom_ = rom_.data();

			switch(target.disk_interface) {
				default: break;
				case DiskInterface::BD500:
					bd500_.set_delegate(this);
				break;
				case DiskInterface::Jasmin:
					jasmin_.set_delegate(this);
				break;
				case DiskInterface::Microdisc:
					microdisc_.set_delegate(this);
				break;
			}

			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			if(target.should_start_jasmin) {
				// If Jasmin autostart is requested then plan to do so in 3 seconds; empirically long enough
				// for the Oric to boot normally, before the Jasmin intercedes.
				jasmin_reset_counter_ = 3000000;
			}

			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:
					tape_get_byte_address_ = 0xe630;
					tape_speed_address_ = 0x67;
				break;
				case Analyser::Static::Oric::Target::ROM::BASIC11:
				case Analyser::Static::Oric::Target::ROM::Pravetz:
					tape_get_byte_address_ = 0xe6c9;
					tape_speed_address_ = 0x024d;
				break;
			}

			insert_media(target.media);
		}